

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plutovg-ft-raster.c
# Opt level: O1

void gray_render_scanline(PWorker worker,TCoord ey,TPos x1,TCoord y1,TPos x2,TCoord y2)

{
  ulong uVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  long ex;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  long lVar10;
  long local_70;
  
  ex = x2 >> 8;
  lVar4 = y2 - y1;
  if (lVar4 == 0) {
    gray_set_cell(worker,ex,ey);
    return;
  }
  lVar10 = x1 >> 8;
  uVar7 = x1 & 0xff;
  if (lVar10 != ex) {
    uVar8 = x2 - x1;
    if (uVar8 == 0 || x2 < x1) {
      uVar8 = -uVar8;
      local_70 = -1;
      uVar6 = 0;
      uVar1 = uVar7;
    }
    else {
      uVar6 = 0x100;
      local_70 = 1;
      uVar1 = 0x100 - uVar7;
    }
    lVar3 = (long)(uVar1 * lVar4) % (long)uVar8;
    uVar9 = lVar3 >> 0x3f;
    lVar5 = (long)(uVar1 * lVar4) / (long)uVar8 + uVar9;
    worker->area = worker->area + (uVar7 | uVar6) * lVar5;
    worker->cover = worker->cover + (int)lVar5;
    y1 = lVar5 + y1;
    gray_set_cell(worker,local_70 + lVar10,ey);
    if (local_70 + lVar10 != ex) {
      lVar5 = (lVar4 * 0x100) % (long)uVar8;
      lVar3 = (uVar9 & uVar8) + lVar3;
      uVar7 = lVar5 >> 0x3f;
      do {
        lVar3 = lVar3 + (uVar7 & uVar8) + lVar5;
        uVar1 = 0;
        if ((long)uVar8 <= lVar3) {
          uVar1 = uVar8;
        }
        lVar2 = (ulong)((long)uVar8 <= lVar3) + (lVar4 * 0x100) / (long)uVar8 + uVar7;
        worker->area = worker->area + lVar2 * 0x100;
        worker->cover = worker->cover + (int)lVar2;
        lVar3 = lVar3 - uVar1;
        y1 = y1 + lVar2;
        gray_set_cell(worker,local_70 * 2 + lVar10,ey);
        lVar10 = lVar10 + local_70;
      } while (ex - local_70 != lVar10);
    }
    uVar7 = 0x100 - uVar6;
  }
  worker->area = worker->area + (uVar7 + (x2 & 0xffU)) * (y2 - y1);
  worker->cover = worker->cover + (int)(y2 - y1);
  return;
}

Assistant:

static void
  gray_render_scanline( RAS_ARG_ TCoord  ey,
                                 TPos    x1,
                                 TCoord  y1,
                                 TPos    x2,
                                 TCoord  y2 )
  {
    TCoord  ex1, ex2, fx1, fx2, first, dy, delta, mod;
    TPos    p, dx;
    int     incr;


    ex1 = TRUNC( x1 );
    ex2 = TRUNC( x2 );

    /* trivial case.  Happens often */
    if ( y1 == y2 )
    {
      gray_set_cell( RAS_VAR_ ex2, ey );
      return;
    }

    fx1   = FRACT( x1 );
    fx2   = FRACT( x2 );

    /* everything is located in a single cell.  That is easy! */
    /*                                                        */
    if ( ex1 == ex2 )
      goto End;

    /* ok, we'll have to render a run of adjacent cells on the same */
    /* scanline...                                                  */
    /*                                                              */
    dx = x2 - x1;
    dy = y2 - y1;

    if ( dx > 0 )
    {
      p     = ( ONE_PIXEL - fx1 ) * dy;
      first = ONE_PIXEL;
      incr  = 1;
    } else {
      p     = fx1 * dy;
      first = 0;
      incr  = -1;
      dx    = -dx;
    }

    PVG_FT_DIV_MOD( TCoord, p, dx, delta, mod );

    ras.area  += (TArea)( fx1 + first ) * delta;
    ras.cover += delta;
    y1        += delta;
    ex1       += incr;
    gray_set_cell( RAS_VAR_ ex1, ey );

    if ( ex1 != ex2 )
    {
      TCoord  lift, rem;


      p = ONE_PIXEL * dy;
      PVG_FT_DIV_MOD( TCoord, p, dx, lift, rem );

      do
      {
        delta = lift;
        mod  += rem;
        if ( mod >= (TCoord)dx )
        {
          mod -= (TCoord)dx;
          delta++;
        }

        ras.area  += (TArea)( ONE_PIXEL * delta );
        ras.cover += delta;
        y1        += delta;
        ex1       += incr;
        gray_set_cell( RAS_VAR_ ex1, ey );
      } while ( ex1 != ex2 );
    }
    fx1 = ONE_PIXEL - first;

  End:
    dy = y2 - y1;

    ras.area  += (TArea)( ( fx1 + fx2 ) * dy );
    ras.cover += dy;
  }